

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_to_proto_test.cc
# Opt level: O0

void __thiscall
upb_test::FuzzTest_DuplicateOneofIndex_Test::TestBody(FuzzTest_DuplicateOneofIndex_Test *this)

{
  string_view local_88;
  ParseTextProtoOrDie local_78;
  FileDescriptorSet local_58;
  FuzzTest_DuplicateOneofIndex_Test *local_10;
  FuzzTest_DuplicateOneofIndex_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_88,
             "file {\n             name: \"F\"\n             message_type {\n               name: \"M\"\n               oneof_decl { name: \"O\" }\n               field { name: \"f1\" number: 1 type: TYPE_INT32 oneof_index: 0 }\n               field { name: \"f2\" number: 1 type: TYPE_INT32 oneof_index: 0 }\n             }\n           }"
            );
  ParseTextProtoOrDie::ParseTextProtoOrDie(&local_78,local_88);
  ParseTextProtoOrDie::operator_cast_to_FileDescriptorSet(&local_58,&local_78);
  RoundTripDescriptor(&local_58);
  google::protobuf::FileDescriptorSet::~FileDescriptorSet(&local_58);
  ParseTextProtoOrDie::~ParseTextProtoOrDie(&local_78);
  return;
}

Assistant:

TEST(FuzzTest, DuplicateOneofIndex) {
  RoundTripDescriptor(ParseTextProtoOrDie(
      R"pb(file {
             name: "F"
             message_type {
               name: "M"
               oneof_decl { name: "O" }
               field { name: "f1" number: 1 type: TYPE_INT32 oneof_index: 0 }
               field { name: "f2" number: 1 type: TYPE_INT32 oneof_index: 0 }
             }
           })pb"));
}